

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::parseType(StructuralParser *this,ParseTypeContext parseContext)

{
  bool bVar1;
  Expression *pEVar2;
  CompileMessage local_58;
  undefined1 local_20 [8];
  pool_ptr<soul::AST::Expression> type;
  ParseTypeContext parseContext_local;
  StructuralParser *this_local;
  
  type.object._4_4_ = parseContext;
  tryParsingType((StructuralParser *)local_20,(ParseTypeContext)this);
  bVar1 = pool_ptr<soul::AST::Expression>::operator==
                    ((pool_ptr<soul::AST::Expression> *)local_20,(void *)0x0);
  if (bVar1) {
    Errors::expectedType<>();
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
    CompileMessage::~CompileMessage(&local_58);
  }
  pEVar2 = pool_ptr<soul::AST::Expression>::operator*((pool_ptr<soul::AST::Expression> *)local_20);
  pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)local_20);
  return pEVar2;
}

Assistant:

AST::Expression& parseType (ParseTypeContext parseContext)
    {
        auto type = tryParsingType (parseContext);

        if (type == nullptr)
            throwError (Errors::expectedType());

        return *type;
    }